

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_ToIndex(JSContext *ctx,uint64_t *plen,JSValue val)

{
  JSValue val_00;
  int iVar1;
  int64_t in_RCX;
  JSValueUnion in_RDX;
  int64_t *in_RSI;
  JSContext *in_RDI;
  int64_t v;
  long local_30;
  int local_4;
  
  val_00.tag = in_RCX;
  val_00.u.float64 = in_RDX.float64;
  iVar1 = JS_ToInt64Sat(in_RDI,in_RSI,val_00);
  if (iVar1 == 0) {
    if ((local_30 < 0) || (0x1fffffffffffff < local_30)) {
      JS_ThrowRangeError(in_RDI,"invalid array index");
      *in_RSI = 0;
      local_4 = -1;
    }
    else {
      *in_RSI = local_30;
      local_4 = 0;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int JS_ToIndex(JSContext *ctx, uint64_t *plen, JSValueConst val)
{
    int64_t v;
    if (JS_ToInt64Sat(ctx, &v, val))
        return -1;
    if (v < 0 || v > MAX_SAFE_INTEGER) {
        JS_ThrowRangeError(ctx, "invalid array index");
        *plen = 0;
        return -1;
    }
    *plen = v;
    return 0;
}